

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDX_ZP(CPU *this)

{
  byte bVar1;
  uint8_t uVar2;
  CPU *this_local;
  
  this->cycles = 3;
  bVar1 = GetByte(this);
  uVar2 = ReadByte(this,(ushort)bVar1);
  this->X = uVar2;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->X == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->X & 0x80) != 0 && -1 < (int)(this->X & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDX_ZP()
{
    cycles = 3;
    X = ReadByte(GetByte());
    Z = (X == 0);
    N = (X & 0b10000000) > 0;
}